

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_global_init(long flags)

{
  CURLcode CVar1;
  undefined1 in_SIL;
  
  curl_simple_lock_lock((atomic_int *)flags);
  CVar1 = global_init(1,(_Bool)in_SIL);
  s_lock = 0;
  return CVar1;
}

Assistant:

CURLcode curl_global_init(long flags)
{
  CURLcode result;
  global_init_lock();

  result = global_init(flags, TRUE);

  global_init_unlock();

  return result;
}